

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O1

void __thiscall Assimp::IrrlichtBase::ReadVectorProperty(IrrlichtBase *this,VectorProperty *out)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Assimp *pAVar2;
  undefined4 extraout_var_02;
  Logger *pLVar3;
  Assimp AVar4;
  uint uVar5;
  Assimp *pAVar6;
  allocator<char> local_69;
  float *local_68;
  float *local_60;
  aiVector3t<float> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (0 < iVar1) {
    local_58 = &out->value;
    local_60 = &(out->value).y;
    local_68 = &(out->value).z;
    uVar5 = 0;
    do {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar5);
      if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
LAB_0044395f:
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar1 = strcasecmp((char *)CONCAT44(extraout_var,iVar1),"name");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,(char *)CONCAT44(extraout_var_02,iVar1),&local_69);
        std::__cxx11::string::operator=((string *)out,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar5);
        if ((char *)CONCAT44(extraout_var_00,iVar1) == (char *)0x0) goto LAB_0044395f;
        iVar1 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
        if (iVar1 == 0) {
          iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar5);
          for (pAVar2 = (Assimp *)CONCAT44(extraout_var_01,iVar1);
              (AVar4 = *pAVar2, AVar4 == (Assimp)0x20 || (AVar4 == (Assimp)0x9));
              pAVar2 = pAVar2 + 1) {
          }
          pAVar2 = (Assimp *)
                   fast_atoreal_move<float>(pAVar2,(char *)local_58,(float *)0x1,(bool)AVar4);
          pAVar6 = pAVar2;
          while( true ) {
            pAVar2 = pAVar2 + 1;
            AVar4 = *pAVar6;
            if ((AVar4 != (Assimp)0x9) && (AVar4 != (Assimp)0x20)) break;
            pAVar6 = pAVar6 + 1;
          }
          if (AVar4 == (Assimp)0x2c) {
            for (; (AVar4 = *pAVar2, AVar4 == (Assimp)0x20 || (AVar4 == (Assimp)0x9));
                pAVar2 = pAVar2 + 1) {
            }
          }
          else {
            pLVar3 = DefaultLogger::get();
            Logger::error(pLVar3,"IRR(MESH): Expected comma in vector definition");
            pAVar2 = pAVar6;
          }
          pAVar2 = (Assimp *)
                   fast_atoreal_move<float>(pAVar2,(char *)local_60,(float *)0x1,(bool)AVar4);
          pAVar6 = pAVar2;
          while( true ) {
            pAVar2 = pAVar2 + 1;
            AVar4 = *pAVar6;
            if ((AVar4 != (Assimp)0x9) && (AVar4 != (Assimp)0x20)) break;
            pAVar6 = pAVar6 + 1;
          }
          if (AVar4 == (Assimp)0x2c) {
            for (; (AVar4 = *pAVar2, AVar4 == (Assimp)0x20 || (AVar4 == (Assimp)0x9));
                pAVar2 = pAVar2 + 1) {
            }
          }
          else {
            pLVar3 = DefaultLogger::get();
            Logger::error(pLVar3,"IRR(MESH): Expected comma in vector definition");
            pAVar2 = pAVar6;
          }
          fast_atoreal_move<float>(pAVar2,(char *)local_68,(float *)0x1,(bool)AVar4);
        }
      }
      uVar5 = uVar5 + 1;
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    } while ((int)uVar5 < iVar1);
  }
  return;
}

Assistant:

void IrrlichtBase::ReadVectorProperty  (VectorProperty&  out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // three floats, separated with commas
            const char* ptr = reader->getAttributeValue(i);

            SkipSpaces(&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.x );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.y );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.z );
        }
    }
}